

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memutil.cc
# Opt level: O0

size_t absl::strings_internal::memcspn(char *s,size_t slen,char *reject)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char sc;
  char *pcStack_38;
  char c;
  char *spanp;
  char *p;
  char *reject_local;
  size_t slen_local;
  char *s_local;
  
  pcVar2 = s;
  reject_local = (char *)slen;
  while (spanp = pcVar2, pcVar3 = reject_local + -1, reject_local != (char *)0x0) {
    pcStack_38 = reject;
    while( true ) {
      cVar1 = *pcStack_38;
      pcVar2 = spanp + 1;
      reject_local = pcVar3;
      if (cVar1 == '\0') break;
      pcStack_38 = pcStack_38 + 1;
      if (cVar1 == *spanp) goto LAB_00522a09;
    }
  }
LAB_00522a09:
  s_local = spanp + -(long)s;
  return (size_t)s_local;
}

Assistant:

size_t memcspn(const char* s, size_t slen, const char* reject) {
  const char* p = s;
  const char* spanp;
  char c, sc;

  while (slen-- != 0) {
    c = *p++;
    for (spanp = reject; (sc = *spanp++) != '\0';)
      if (sc == c) return p - 1 - s;
  }
  return p - s;
}